

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

bool __thiscall
chaiscript::parser::ChaiScript_Parser::Quoted_String(ChaiScript_Parser *this,bool t_capture)

{
  undefined8 t_match_start;
  bool bVar1;
  bool bVar2;
  undefined7 in_register_00000031;
  _Alloc_hider _Var3;
  string match;
  size_type prev_stack_top;
  Position start;
  string local_f0;
  undefined1 local_d0 [72];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_78;
  string local_68;
  long *local_48 [2];
  long local_38 [2];
  
  SkipWS(this,false);
  if ((int)CONCAT71(in_register_00000031,t_capture) == 0) {
    bVar1 = Quoted_String_(this);
    return bVar1;
  }
  local_d0._40_4_ = (this->m_position).line;
  local_d0._44_4_ = (this->m_position).col;
  local_d0._48_8_ = (this->m_position).m_pos._M_current;
  local_d0._56_8_ = (this->m_position).m_end._M_current;
  local_d0._64_8_ = *(undefined8 *)&(this->m_position).m_last_col;
  bVar1 = Quoted_String_(this);
  if (!bVar1) {
    return bVar1;
  }
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_d0._32_8_ =
       (long)(this->m_match_stack).
             super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->m_match_stack).
             super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4;
  local_d0._24_8_ = local_d0 + 0x20;
  local_d0._0_8_ = &local_f0;
  local_d0._8_8_ = local_d0 + 0x28;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_d0._16_8_ = this;
  bVar2 = Quoted_String::anon_class_32_4_0aede7d2::operator()((anon_class_32_4_0aede7d2 *)local_d0);
  if (bVar2) {
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,local_f0._M_dataplus._M_p,
               local_f0._M_dataplus._M_p + local_f0._M_string_length);
    make_node<chaiscript::eval::Quoted_String_AST_Node>
              ((ChaiScript_Parser *)local_d0,&this->m_multiline_comment_begin,(int)local_48,
               local_d0._40_4_);
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
    ::emplace_back<std::shared_ptr<chaiscript::AST_Node>>
              ((vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
                *)&this->m_match_stack,(shared_ptr<chaiscript::AST_Node> *)local_d0);
    if ((Position *)local_d0._8_8_ != (Position *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_);
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    t_match_start = local_d0._32_8_;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"+","");
    build_match<chaiscript::eval::Binary_Operator_AST_Node>(this,t_match_start,&local_68);
    local_78._vptr__Sp_counted_base = (_func_int **)local_68.field_2._M_allocated_capacity;
    _Var3._M_p = local_68._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) goto LAB_00191e4d;
  }
  else {
    local_88[0] = &local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,local_f0._M_dataplus._M_p,
               local_f0._M_dataplus._M_p + local_f0._M_string_length);
    make_node<chaiscript::eval::Quoted_String_AST_Node>
              ((ChaiScript_Parser *)local_d0,&this->m_multiline_comment_begin,(int)local_88,
               local_d0._40_4_);
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
    ::emplace_back<std::shared_ptr<chaiscript::AST_Node>>
              ((vector<std::shared_ptr<chaiscript::AST_Node>,std::allocator<std::shared_ptr<chaiscript::AST_Node>>>
                *)&this->m_match_stack,(shared_ptr<chaiscript::AST_Node> *)local_d0);
    if ((Position *)local_d0._8_8_ != (Position *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_);
    }
    _Var3._M_p = (pointer)local_88[0];
    if (local_88[0] == &local_78) goto LAB_00191e4d;
  }
  operator_delete(_Var3._M_p,
                  (ulong)((long)&(((pointer)local_78._vptr__Sp_counted_base)->
                                 super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr + 1));
LAB_00191e4d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                             local_f0.field_2._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

bool Quoted_String(const bool t_capture = false) {
        SkipWS();

        if (!t_capture) {
          return Quoted_String_();
        } else {
          const auto start = m_position;

          if (Quoted_String_()) {
            std::string match;
            const auto prev_stack_top = m_match_stack.size();

            bool is_interpolated = [&]()->bool {
              Char_Parser<std::string> cparser(match, true);


              auto s = start + 1, end = m_position - 1;

              while (s != end) {
                if (cparser.saw_interpolation_marker) {
                  if (*s == '{') {
                    //We've found an interpolation point

                    if (cparser.is_interpolated) {
                      //If we've seen previous interpolation, add on instead of making a new one
                      m_match_stack.push_back(make_node<eval::Quoted_String_AST_Node>(match, start.line, start.col));

                      build_match<eval::Binary_Operator_AST_Node>(prev_stack_top, "+");
                    } else {
                      m_match_stack.push_back(make_node<eval::Quoted_String_AST_Node>(match, start.line, start.col));
                    }

                    //We've finished with the part of the string up to this point, so clear it
                    match.clear();

                    std::string eval_match;

                    ++s;
                    while ((s != end) && (*s != '}')) {
                      eval_match.push_back(*s);
                      ++s;
                    }

                    if (*s == '}') {
                      cparser.is_interpolated = true;
                      ++s;

                      const auto tostr_stack_top = m_match_stack.size();

                      m_match_stack.push_back(make_node<eval::Id_AST_Node>("to_string", start.line, start.col));

                      const auto ev_stack_top = m_match_stack.size();

                      try {
                        ChaiScript_Parser parser;
                        parser.parse(eval_match, "instr eval");
                        m_match_stack.push_back(parser.ast());
                      } catch (const exception::eval_error &e) {
                        throw exception::eval_error(e.what(), File_Position(start.line, start.col), *m_filename);
                      }

                      build_match<eval::Arg_List_AST_Node>(ev_stack_top);
                      build_match<eval::Fun_Call_AST_Node>(tostr_stack_top);
                      build_match<eval::Binary_Operator_AST_Node>(prev_stack_top, "+");
                    } else {
                      throw exception::eval_error("Unclosed in-string eval", File_Position(start.line, start.col), *m_filename);
                    }
                  } else {
                    match.push_back('$');
                  }
                  cparser.saw_interpolation_marker = false;
                } else {
                  cparser.parse(*s, start.line, start.col, *m_filename);
                  ++s;
                }
              }

              return cparser.is_interpolated;
            }();

            if (is_interpolated) {
              m_match_stack.push_back(make_node<eval::Quoted_String_AST_Node>(match, start.line, start.col));

              build_match<eval::Binary_Operator_AST_Node>(prev_stack_top, "+");
            } else {
              m_match_stack.push_back(make_node<eval::Quoted_String_AST_Node>(match, start.line, start.col));
            }
            return true;
          } else {
            return false;
          }
        }
      }